

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O2

void __thiscall
boost::shared_ptr<BGIP_BnB_Node>::shared_ptr<BGIP_BnB_Node>
          (shared_ptr<BGIP_BnB_Node> *this,BGIP_BnB_Node *p)

{
  this->px = p;
  (this->pn).pi_ = (sp_counted_base *)0x0;
  detail::sp_pointer_construct<BGIP_BnB_Node,BGIP_BnB_Node>(this,p,&this->pn);
  return;
}

Assistant:

explicit shared_ptr( Y * p ): px( p ), pn() // Y must be complete
    {
        boost::detail::sp_pointer_construct( this, p, pn );
    }